

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

void adt_hash_create(adt_hash_t *self,_func_void_void_ptr *pDestructor)

{
  adt_hnode_t *node;
  
  node = (adt_hnode_t *)malloc(0x10);
  if (node != (adt_hnode_t *)0x0) {
    adt_hnode_create(node);
    self->root = node;
    self->u32Size = 0;
    self->pDestructor = pDestructor;
    adt_stack_create(&self->iter_stack,adt_hit_stored_delete_void);
    (self->iter).pNode = (adt_hnode_t *)0x0;
    (self->iter).pHkey = (adt_hkey_t *)0x0;
    (self->iter).u8Cur = '\0';
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                ,0x118,"adt_hnode_t *adt_hnode_new(void)");
}

Assistant:

void adt_hash_create(adt_hash_t *self,void (*pDestructor)(void*)){
	self->root = adt_hnode_new();
	self->u32Size = 0;
	self->pDestructor = pDestructor;
	adt_stack_create(&self->iter_stack,adt_hit_stored_delete_void);
	self->iter.pHkey = 0;
	self->iter.pNode = 0;
	self->iter.u8Cur = 0;
}